

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemach_act(connectdata *conn)

{
  int *piVar1;
  curl_off_t *pcVar2;
  curl_usessl cVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  _Bool _Var7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  uint uVar11;
  CURLofft CVar12;
  ulong uVar13;
  size_t sVar14;
  imapstate instate;
  size_t __n;
  curl_off_t size_00;
  ulong len;
  Curl_easy *pCVar15;
  char *pcVar16;
  pingpong *ppVar17;
  byte *ptr;
  ulong uStackY_90;
  curl_off_t size;
  pingpong *local_58;
  curl_socket_t local_50;
  int imapcode;
  SASL *local_48;
  size_t nread;
  char *local_38;
  
  local_50 = conn->sock[0];
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar8 = imap_perform_upgrade_tls(conn);
    return CVar8;
  }
  ppVar17 = (pingpong *)&conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(ppVar17);
    return CVar8;
  }
  local_48 = &(conn->proto).imapc.sasl;
  local_58 = ppVar17;
  do {
    CVar8 = Curl_pp_readresp(local_50,ppVar17,&imapcode,&nread);
    ppVar17 = local_58;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (imapcode == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (imapcode == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (imapcode != 1) {
        pCVar15 = conn->data;
        if (imapcode != 3) {
          Curl_failf(pCVar15,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar15,"PREAUTH connection, already authenticated!\n");
      }
      CVar9 = imap_perform_capability(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar15 = conn->data;
      if (imapcode != 1) {
        if (imapcode == 0x2a) {
          ptr = (byte *)((pCVar15->state).buffer + 2);
LAB_00130a05:
          do {
            uVar13 = (ulong)*ptr;
            if (uVar13 < 0x21) {
              if ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0) {
                ptr = ptr + 1;
                goto LAB_00130a05;
              }
              if (uVar13 == 0) goto LAB_00130ca6;
            }
            sVar14 = 0xfffffffffffffffb;
            while ((0x20 < (byte)uVar13 || ((0x100002601U >> (uVar13 & 0x3f) & 1) == 0))) {
              lVar6 = sVar14 + 6;
              sVar14 = sVar14 + 1;
              uVar13 = (ulong)ptr[lVar6];
            }
            uStackY_90 = sVar14 + 5;
            if (uStackY_90 == 7) {
              iVar10 = bcmp(ptr,"SASL-IR",7);
              if (iVar10 != 0) goto LAB_00130abf;
              (conn->proto).imapc.ir_supported = true;
              uStackY_90 = 7;
            }
            else if (uStackY_90 == 0xd) {
              iVar10 = bcmp(ptr,"LOGINDISABLED",0xd);
              if (iVar10 != 0) goto LAB_00130abf;
              (conn->proto).imapc.login_disabled = true;
              uStackY_90 = 0xd;
            }
            else if (uStackY_90 == 8) {
              if (*(long *)ptr != 0x534c545452415453) goto LAB_00130abf;
              (conn->proto).imapc.tls_supported = true;
              uStackY_90 = 8;
            }
            else if (5 < uStackY_90) {
LAB_00130abf:
              iVar10 = bcmp(ptr,"AUTH=",5);
              if (iVar10 == 0) {
                ptr = ptr + 5;
                uVar11 = Curl_sasl_decode_mech((char *)ptr,sVar14,(size_t *)&size);
                uStackY_90 = sVar14;
                if ((uVar11 != 0) && (size == sVar14)) {
                  piVar1 = &(conn->proto).ftpc.diralloc;
                  *piVar1 = *piVar1 | uVar11;
                }
              }
            }
            ptr = ptr + uStackY_90;
          } while( true );
        }
LAB_00130c92:
        CVar9 = imap_perform_authentication(conn);
        break;
      }
      cVar3 = (pCVar15->set).use_ssl;
      if ((cVar3 == CURLUSESSL_NONE) || (conn->ssl[0].use != false)) goto LAB_00130c92;
      if ((conn->proto).imapc.tls_supported != true) {
        if (cVar3 != CURLUSESSL_TRY) {
          pcVar16 = "STARTTLS not supported.";
          goto LAB_00130ecc;
        }
        goto LAB_00130c92;
      }
      CVar8 = imap_sendf(conn,"STARTTLS");
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      (conn->proto).imapc.state = IMAP_STARTTLS;
      goto LAB_00130cb3;
    case IMAP_STARTTLS:
      if (imapcode != 1) {
        pCVar15 = conn->data;
        if ((pCVar15->set).use_ssl != CURLUSESSL_TRY) {
          pcVar16 = "STARTTLS denied";
LAB_00130ecc:
          Curl_failf(pCVar15,pcVar16);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00130c92;
      }
      CVar9 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_00130892_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar15 = conn->data;
      CVar9 = Curl_sasl_continue(local_48,conn,imapcode,(saslprogress *)&size);
      if (CVar9 == CURLE_OK) {
        if ((int)size == 0) {
          if (((conn->proto).imapc.login_disabled == false) &&
             (((conn->proto).ftpc.cwdfail & 1U) != 0)) {
            CVar9 = imap_perform_login(conn);
          }
          else {
            Curl_failf(pCVar15,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar9 = CURLE_OK;
          CVar8 = CURLE_OK;
          if ((int)size == 2) goto LAB_00130c3d;
        }
      }
      break;
    case IMAP_LOGIN:
      if (imapcode != 1) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)imapcode);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_00130892_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar9 = imap_state_listsearch_resp(conn,imapcode,instate);
      break;
    case IMAP_SELECT:
      pCVar15 = conn->data;
      if (imapcode == 1) {
        pvVar4 = (pCVar15->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) != (char *)0x0) &&
            (pcVar16 = (conn->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
           (iVar10 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar16), iVar10 == 0)) {
          Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar16 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar16;
        if (*(long *)((long)pvVar4 + 0x40) == 0) {
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            CVar9 = imap_perform_fetch(conn);
          }
          else {
            CVar9 = imap_perform_search(conn);
          }
        }
        else {
          CVar9 = imap_perform_list(conn);
        }
        break;
      }
      if (imapcode != 0x2a) {
        Curl_failf(pCVar15,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      iVar10 = __isoc99_sscanf((pCVar15->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",&size)
      ;
      if (iVar10 == 1) {
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar16 = (*Curl_cstrdup)((char *)&size);
        (conn->proto).imapc.mailbox_uidvalidity = pcVar16;
      }
      goto LAB_00130ca6;
    case IMAP_FETCH:
      pCVar15 = conn->data;
      pcVar16 = (pCVar15->state).buffer;
      size = 0;
      pcVar5 = pcVar16;
      if (imapcode == 0x2a) {
        while( true ) {
          if (*pcVar5 == '\0') break;
          if (*pcVar5 == '{') {
            CVar12 = curlx_strtoofft(pcVar5 + 1,&local_38,10,&size);
            if ((((CVar12 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar16)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              Curl_infof(pCVar15,"Found %ld bytes to download\n",size);
              Curl_pgrsSetDownloadSize(pCVar15,size);
              pcVar16 = ((pingpong *)&ppVar17->cache)->cache;
              if (pcVar16 != (char *)0x0) {
                uVar13 = (conn->proto).ftpc.pp.cache_size;
                len = size;
                if (uVar13 < (ulong)size) {
                  len = uVar13;
                }
                if (len == 0) {
                  CVar8 = CURLE_OK;
                  goto LAB_00130c3d;
                }
                CVar9 = Curl_client_write(conn,1,pcVar16,len);
                if (CVar9 != CURLE_OK) goto LAB_00130c9d;
                pcVar2 = &(pCVar15->req).bytecount;
                *pcVar2 = *pcVar2 + len;
                Curl_infof(pCVar15,"Written %zu bytes, %lu bytes are left for transfer\n",len);
                ppVar17 = local_58;
                uVar13 = (conn->proto).ftpc.pp.cache_size;
                __n = uVar13 - len;
                if (uVar13 < len || __n == 0) {
                  (*Curl_cfree)(((pingpong *)&local_58->cache)->cache);
                  ((pingpong *)&ppVar17->cache)->cache = (char *)0x0;
                  sVar14 = 0;
                }
                else {
                  memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + len),__n);
                  sVar14 = (conn->proto).ftpc.pp.cache_size - len;
                }
                (conn->proto).ftpc.pp.cache_size = sVar14;
              }
              if ((pCVar15->req).bytecount == size) {
                iVar10 = -1;
                size_00 = -1;
              }
              else {
                (pCVar15->req).maxdownload = size;
                iVar10 = 0;
                size_00 = size;
              }
              Curl_setup_transfer(conn,iVar10,size_00,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              CVar8 = CURLE_OK;
              goto LAB_00130c3d;
            }
            break;
          }
          pcVar16 = pcVar16 + 1;
          pcVar5 = pcVar5 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar15,-1);
        CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00130c3d:
      CVar9 = CVar8;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (imapcode != 1) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto switchD_00130892_caseD_4;
    case IMAP_APPEND:
      if (imapcode != 0x2b) {
        return CURLE_UPLOAD_FAILED;
      }
      Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_APPEND_FINAL:
      if (imapcode != 1) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_00130892_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
LAB_00130c9d:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
LAB_00130ca6:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00130cb3:
    ppVar17 = local_58;
    _Var7 = Curl_pp_moredata(local_58);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}